

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ord_hash_set.h
# Opt level: O1

size_t __thiscall re2c::ord_hash_set_t::insert(ord_hash_set_t *this,void *data,size_t size)

{
  _Rb_tree_header *p_Var1;
  pointer *pppeVar2;
  elem_t *peVar3;
  iterator __position;
  int iVar4;
  mapped_type *ppeVar5;
  elem_t *peVar6;
  size_t sVar7;
  _Base_ptr p_Var8;
  _Base_ptr unaff_R12;
  _Base_ptr p_Var9;
  hash_t h;
  ulong local_40;
  map<unsigned_long,_re2c::ord_hash_set_t::elem_t_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_re2c::ord_hash_set_t::elem_t_*>_>_>
  *local_38;
  
  local_40 = size;
  if (size != 0) {
    sVar7 = 0;
    do {
      local_40 = local_40 ^ (ulong)*(byte *)((long)data + sVar7) + (local_40 >> 2) + local_40 * 0x20
      ;
      sVar7 = sVar7 + 1;
    } while (size != sVar7);
  }
  p_Var1 = &(this->lookup)._M_t._M_impl.super__Rb_tree_header;
  p_Var9 = (this->lookup)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var8 = &p_Var1->_M_header;
  for (; p_Var9 != (_Base_ptr)0x0; p_Var9 = (&p_Var9->_M_left)[*(ulong *)(p_Var9 + 1) < local_40]) {
    if (*(ulong *)(p_Var9 + 1) >= local_40) {
      p_Var8 = p_Var9;
    }
  }
  p_Var9 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var8 != p_Var1) && (p_Var9 = p_Var8, local_40 < *(ulong *)(p_Var8 + 1)))
  {
    p_Var9 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var9 != p_Var1) {
    for (p_Var9 = p_Var9[1]._M_parent; p_Var9 != (_Base_ptr)0x0; p_Var9 = *(_Base_ptr *)p_Var9) {
      if ((p_Var9->_M_left == (_Base_ptr)size) &&
         (iVar4 = bcmp(&p_Var9->_M_right,data,size), iVar4 == 0)) {
        unaff_R12 = p_Var9->_M_parent;
        break;
      }
    }
    if (p_Var9 != (_Base_ptr)0x0) {
      return (size_t)unaff_R12;
    }
  }
  local_38 = &this->lookup;
  p_Var9 = (_Base_ptr)
           ((long)(this->elems).
                  super__Vector_base<re2c::ord_hash_set_t::elem_t_*,_std::allocator<re2c::ord_hash_set_t::elem_t_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->elems).
                  super__Vector_base<re2c::ord_hash_set_t::elem_t_*,_std::allocator<re2c::ord_hash_set_t::elem_t_*>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3);
  ppeVar5 = std::
            map<unsigned_long,_re2c::ord_hash_set_t::elem_t_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_re2c::ord_hash_set_t::elem_t_*>_>_>
            ::operator[](local_38,&local_40);
  peVar3 = *ppeVar5;
  peVar6 = (elem_t *)malloc(size + 0x18);
  peVar6->next = peVar3;
  peVar6->index = (size_t)p_Var9;
  peVar6->size = size;
  memcpy(peVar6->data,data,size);
  ppeVar5 = std::
            map<unsigned_long,_re2c::ord_hash_set_t::elem_t_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_re2c::ord_hash_set_t::elem_t_*>_>_>
            ::operator[](local_38,&local_40);
  *ppeVar5 = peVar6;
  __position._M_current =
       (this->elems).
       super__Vector_base<re2c::ord_hash_set_t::elem_t_*,_std::allocator<re2c::ord_hash_set_t::elem_t_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->elems).
      super__Vector_base<re2c::ord_hash_set_t::elem_t_*,_std::allocator<re2c::ord_hash_set_t::elem_t_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<re2c::ord_hash_set_t::elem_t*,std::allocator<re2c::ord_hash_set_t::elem_t*>>::
    _M_realloc_insert<re2c::ord_hash_set_t::elem_t*const&>
              ((vector<re2c::ord_hash_set_t::elem_t*,std::allocator<re2c::ord_hash_set_t::elem_t*>>
                *)this,__position,ppeVar5);
  }
  else {
    *__position._M_current = peVar6;
    pppeVar2 = &(this->elems).
                super__Vector_base<re2c::ord_hash_set_t::elem_t_*,_std::allocator<re2c::ord_hash_set_t::elem_t_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppeVar2 = *pppeVar2 + 1;
  }
  return (size_t)p_Var9;
}

Assistant:

size_t ord_hash_set_t::insert(const void *data, size_t size)
{
	const hash_t h = hash(data, size);

	std::map<hash_t, elem_t*>::const_iterator i = lookup.find(h);
	if (i != lookup.end())
	{
		for (elem_t *e = i->second; e; e = e->next)
		{
			if (e->size == size
				&& memcmp(e->data, data, size) == 0)
			{
				return e->index;
			}
		}
	}

	const size_t index = elems.size();
	elems.push_back(lookup[h] = make_elem(lookup[h], index, size, data));
	return index;
}